

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwRelink(mwData *mw,char *file,int line)

{
  mwData *pmVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  mwStat *pmVar6;
  char *pcVar7;
  byte bVar8;
  char *local_90;
  char *local_70;
  mwStat *ms;
  long size;
  long count;
  mwData *mw2;
  mwData *mw1;
  int fails;
  int line_local;
  char *file_local;
  mwData *mw_local;
  
  _fails = file;
  if (file == (char *)0x0) {
    _fails = "unknown";
  }
  if (mw == (mwData *)0x0) {
    mwWrite("relink: cannot repair MW at NULL\n");
    mwFlush();
  }
  else {
    iVar5 = mwIsSafeAddr(mw,mwDataSize);
    if (iVar5 != 0) {
      mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n",mwCounter,_fails,
              (ulong)(uint)line,mw);
      mwFlush();
      bVar8 = false;
      if (mwHead == mw) {
        mwWrite("relink: MW-%p is the head (first) allocation\n",mw);
        if (mw->prev != (mwData *)0x0) {
          mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n",mw);
          mw->prev = (mwData *)0x0;
        }
      }
      else {
        iVar5 = mwIsSafeAddr(mwHead,mwDataSize);
        if (iVar5 == 0) {
          mwWrite("relink: failed for MW-%p; head pointer destroyed\n",mw);
          mwFlush();
          goto LAB_0010bbb9;
        }
        for (mw2 = mwHead; mw2 != (mwData *)0x0; mw2 = mw2->next) {
          if (mw2->next == mw) {
            mw->prev = mw2;
            break;
          }
          if ((mw2->next != (mwData *)0x0) &&
             ((iVar5 = mwIsSafeAddr(mw2->next,mwDataSize), iVar5 == 0 || (mw2->next->prev != mw2))))
          {
            mwWrite("relink: failed for MW-%p; forward chain fragmented at MW-%p: \'next\' is %p\n",
                    mw,mw2,mw2->next);
            mwFlush();
            goto LAB_0010bbb9;
          }
        }
        bVar8 = mw2 == (mwData *)0x0;
        if ((bool)bVar8) {
          mwWrite("relink: MW-%p not found in forward chain search\n",mw);
          mwFlush();
        }
      }
      if (mwTail == mw) {
        mwWrite("relink: MW-%p is the tail (last) allocation\n",mw);
        if (mw->next != (mwData *)0x0) {
          mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n",mw);
          mw->next = (mwData *)0x0;
        }
      }
      else {
        iVar5 = mwIsSafeAddr(mwTail,mwDataSize);
        if (iVar5 == 0) {
          mwWrite("relink: failed for MW-%p; tail pointer destroyed\n",mw);
          mwFlush();
          goto LAB_0010bbb9;
        }
        for (mw2 = mwTail; mw2 != (mwData *)0x0; mw2 = mw2->prev) {
          if (mw2->prev == mw) {
            mw->next = mw2;
            break;
          }
          if ((mw2->prev != (mwData *)0x0) &&
             ((iVar5 = mwIsSafeAddr(mw2->prev,mwDataSize), iVar5 == 0 || (mw2->prev->next != mw2))))
          {
            mwWrite("relink: failed for MW-%p; reverse chain fragmented at MW-%p, \'prev\' is %p\n",
                    mw,mw2,mw2->prev);
            mwFlush();
            goto LAB_0010bbb9;
          }
        }
        if (mw2 == (mwData *)0x0) {
          mwWrite("relink: MW-%p not found in reverse chain search\n",mw);
          mwFlush();
          bVar8 = bVar8 + 1;
        }
      }
      if (bVar8 < 2) {
        iVar5 = mwIsReadAddr(mw->file,1);
        if ((iVar5 != 0) && (pmVar6 = mwStatGet(mw->file,-1,0), pmVar6 == (mwStat *)0x0)) {
          mw->file = "<relinked>";
        }
        mw->check = mw->count ^ 0xfe0180U ^ mw->size ^ (long)mw->line;
      }
      else {
        mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n",mw);
        mwFlush();
      }
      goto LAB_0010c2d2;
    }
    mwWrite("relink: MW-%p is a garbage pointer\n",mw);
    mwFlush();
  }
LAB_0010bbb9:
  if ((mwHead == (mwData *)0x0) && (mwTail == (mwData *)0x0)) {
    if (mwStatCurAlloc == 0) {
      mwWrite("relink: <%ld> %s(%d) heap is empty, nothing to repair\n",mwCounter,_fails,
              (ulong)(uint)line);
    }
    else {
      mwWrite("relink: <%ld> %s(%d) heap damaged beyond repair\n",mwCounter,_fails,(ulong)(uint)line
             );
    }
    mwFlush();
    return 0;
  }
  mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n",mwCounter,_fails,
          (ulong)(uint)line);
  mwFlush();
  if ((mwHead == (mwData *)0x0) || (mwTail == (mwData *)0x0)) {
    if (mwHead == (mwData *)0x0) {
      mwWrite("relink: mwHead is NULL, but mwTail is %p\n",mwTail);
    }
    else {
      mwWrite("relink: mwTail is NULL, but mwHead is %p\n",mwHead);
    }
  }
  mw2 = (mwData *)0x0;
  if (mwHead != (mwData *)0x0) {
    iVar5 = mwIsReadAddr(mwHead,mwDataSize);
    if ((iVar5 == 0) ||
       (mwHead->check != (mwHead->count ^ 0xfe0180U ^ mwHead->size ^ (long)mwHead->line))) {
      mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n",mwHead);
      mwHead = (mwData *)0x0;
    }
    else {
      if (mwHead->prev != (mwData *)0x0) {
        mwWrite("relink: the mwHead pointer\'s \'prev\' member is %p, not NULL\n",mwHead->prev);
      }
      for (mw2 = mwHead; mw2 != (mwData *)0x0; mw2 = mw2->next) {
        if ((mw2->next != (mwData *)0x0) &&
           (((iVar5 = mwIsReadAddr(mw2->next,mwDataSize), iVar5 == 0 ||
             ((long)(int)(uint)((mw2->next->check != 0 ^ 0xffU) & 1) !=
              (mw2->count ^ 0xfe0180U ^ mw2->size ^ (long)mw2->line))) || (mw2->next->prev != mw2)))
           ) {
          pcVar7 = "";
          if ((mw->flag & 1) != 0) {
            pcVar7 = "NoMansLand ";
          }
          mwWrite("relink: forward chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",mw2,
                  mw2->size,pcVar7,mw2->file,(ulong)(uint)mw2->line);
          iVar5 = mwIsReadAddr(mw2->next,mwDataSize);
          if (iVar5 == 0) {
            mwWrite("relink: the \'next\' pointer of this MW points to %p, which is out-of-legal-access\n"
                    ,mw2->next);
          }
          else {
            pmVar1 = mw2->next;
            sVar2 = mw2->size;
            pcVar7 = "";
            if ((mw->flag & 1) != 0) {
              pcVar7 = "NoMansLand ";
            }
            iVar5 = mwIsReadAddr(mw2->file,0x10);
            if (iVar5 == 0) {
              local_70 = "<garbage-pointer>";
            }
            else {
              local_70 = mw2->file;
            }
            mwWrite("relink: forward chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
                    pmVar1,sVar2,pcVar7,local_70,(ulong)(uint)mw2->line);
          }
          break;
        }
      }
    }
  }
  count = 0;
  if (mwTail != (mwData *)0x0) {
    iVar5 = mwIsReadAddr(mwTail,mwDataSize);
    if ((iVar5 == 0) ||
       (mwTail->check != (mwTail->count ^ 0xfe0180U ^ mwTail->size ^ (long)mwTail->line))) {
      mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n",mwTail);
      mwTail = (mwData *)0x0;
    }
    else {
      if (mwTail->next != (mwData *)0x0) {
        mwWrite("relink: the mwTail pointer\'s \'next\' member is %p, not NULL\n",mwTail->next);
      }
      for (count = (long)mwTail; count != 0; count = *(long *)count) {
        if ((*(long *)count != 0) &&
           (((iVar5 = mwIsReadAddr(*(void **)count,mwDataSize), iVar5 == 0 ||
             ((long)(int)(uint)((*(long *)(*(long *)count + 0x20) != 0 ^ 0xffU) & 1) !=
              (*(ulong *)(count + 0x18) ^ 0xfe0180 ^ *(ulong *)(count + 0x28) ^
              (long)*(int *)(count + 0x30)))) || (*(long *)(*(long *)count + 8) != count)))) {
          pcVar7 = "";
          if ((mw->flag & 1) != 0) {
            pcVar7 = "NoMansLand ";
          }
          mwWrite("relink: reverse chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",count,
                  *(undefined8 *)(count + 0x28),pcVar7,*(undefined8 *)(count + 0x10),
                  (ulong)*(uint *)(count + 0x30));
          iVar5 = mwIsReadAddr(*(void **)count,mwDataSize);
          if (iVar5 == 0) {
            mwWrite("relink: the \'prev\' pointer of this MW points to %p, which is out-of-legal-access\n"
                    ,*(undefined8 *)count);
          }
          else {
            uVar3 = *(undefined8 *)count;
            uVar4 = *(undefined8 *)(count + 0x28);
            pcVar7 = "";
            if ((mw->flag & 1) != 0) {
              pcVar7 = "NoMansLand ";
            }
            iVar5 = mwIsReadAddr(*(void **)(count + 0x10),0x10);
            if (iVar5 == 0) {
              local_90 = "<garbage-pointer>";
            }
            else {
              local_90 = *(char **)(count + 0x10);
            }
            mwWrite("relink: reverse chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
                    uVar3,uVar4,pcVar7,local_90,(ulong)*(uint *)(count + 0x30));
          }
          break;
        }
      }
    }
  }
  if ((mwHead == (mwData *)0x0) && (mwTail == (mwData *)0x0)) {
    mwWrite("relink: both head and tail pointers damaged, aborting program\n");
    mwFlushW(1);
    mwFlush();
    abort();
  }
  if (mwHead == (mwData *)0x0) {
    mwHead = (mwData *)count;
    mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n",count);
    *(undefined8 *)count = 0;
    count = 0;
    mw2 = (mwData *)0x0;
  }
  if (mwTail == (mwData *)0x0) {
    mwTail = mw2;
    mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n",mw2);
    mw2->next = (mwData *)0x0;
    count = 0;
    mw2 = (mwData *)0x0;
  }
  if ((((mw2 == (mwData *)0x0) && (count == 0)) && (mwHead->prev == (mwData *)0x0)) &&
     (mwTail->next == (mwData *)0x0)) {
    mwWrite("relink: verifying heap integrity...\n");
    mwFlush();
  }
  else {
    if (((mw2 == (mwData *)0x0) || (count == 0)) || (mw2 == (mwData *)count)) {
      mwWrite("relink: heap totally destroyed, aborting program\n");
      mwFlushW(1);
      mwFlush();
      abort();
    }
    mw2->next = (mwData *)count;
    *(mwData **)count = mw2;
    mwWrite("relink: emergency repairs successful, assessing damage...\n");
    mwFlush();
  }
LAB_0010c2d2:
  iVar5 = mwIsHeapOK((mwData *)0x0);
  if (iVar5 != 0) {
    size = 0;
    ms = (mwStat *)0x0;
    for (mw2 = mwHead; mw2 != (mwData *)0x0; mw2 = mw2->next) {
      size = size + 1;
      ms = (mwStat *)((long)&ms->next + mw2->size);
    }
    if (size == mwNumCurAlloc) {
      mwWrite("relink: successful, ");
      if (ms == (mwStat *)mwStatCurAlloc) {
        mwWrite("no allocations lost\n");
      }
      else if (mw != (mwData *)0x0) {
        mwWrite("size information lost for MW-%p\n",mw);
        mw->size = 0;
      }
      mw_local._4_4_ = 1;
    }
    else {
      mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
              (mwNmlNumAlloc + mwNumCurAlloc) - size,(mwNmlCurAlloc + mwStatCurAlloc) - (long)ms);
      mw_local._4_4_ = 0;
    }
    return mw_local._4_4_;
  }
  mwWrite("relink: heap verification FAILS - aborting program\n");
  mwFlushW(1);
  mwFlush();
  abort();
}

Assistant:

static int mwRelink(mwData *mw, const char *file, int line)
{
	int fails;
	mwData *mw1, *mw2;
	long count, size;
	mwStat *ms;

	if (file == NULL) {
		file = "unknown";
	}

	if (mw == NULL) {
		mwWrite("relink: cannot repair MW at NULL\n");
		FLUSH();
		goto emergency;
	}

	if (!mwIsSafeAddr(mw, mwDataSize)) {
		mwWrite("relink: MW-%p is a garbage pointer\n", mw);
		FLUSH();
		goto emergency;
	}

	mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n", mwCounter, file, line, mw);
	FLUSH();
	fails = 0;

	/* Repair from head */
	if (mwHead != mw) {
		if (!mwIsSafeAddr(mwHead, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; head pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next == mw) {
				mw->prev = mw1;
				break;
			}
			if (mw1->next &&
				(!mwIsSafeAddr(mw1->next, mwDataSize) || mw1->next->prev != mw1)) {
				mwWrite("relink: failed for MW-%p; forward chain fragmented at MW-%p: 'next' is %p\n", mw, mw1, mw1->next);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in forward chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the head (first) allocation\n", mw);
		if (mw->prev != NULL) {
			mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n", mw);
			mw->prev = NULL;
		}
	}

	/* Repair from tail */
	if (mwTail != mw) {
		if (!mwIsSafeAddr(mwTail, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; tail pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwTail; mw1; mw1 = mw1->prev) {
			if (mw1->prev == mw) {
				mw->next = mw1;
				break;
			}
			if (mw1->prev && (!mwIsSafeAddr(mw1->prev, mwDataSize) || mw1->prev->next != mw1)) {
				mwWrite("relink: failed for MW-%p; reverse chain fragmented at MW-%p, 'prev' is %p\n", mw, mw1, mw1->prev);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in reverse chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the tail (last) allocation\n", mw);
		if (mw->next != NULL) {
			mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n", mw);
			mw->next = NULL;
		}
	}

	if (fails > 1) {
		mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n", mw);
		FLUSH();
		goto verifyok;
	}

	/* restore MW info where possible */
	if (mwIsReadAddr(mw->file, 1)) {
		ms = mwStatGet(mw->file, -1, 0);
		if (ms == NULL) {
			mw->file = "<relinked>";
		}
	}
	mw->check = CHKVAL(mw);
	goto verifyok;

	/* Emergency repair */
emergency:

	if (mwHead == NULL && mwTail == NULL) {
		if (mwStatCurAlloc == 0) {
			mwWrite("relink: <%ld> %s(%d) heap is empty, nothing to repair\n", mwCounter, file, line);
		} else {
			mwWrite("relink: <%ld> %s(%d) heap damaged beyond repair\n", mwCounter, file, line);
		}
		FLUSH();
		return 0;
	}

	mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n", mwCounter, file, line);
	FLUSH();

	if (mwHead == NULL || mwTail == NULL) {
		if (mwHead == NULL) {
			mwWrite("relink: mwHead is NULL, but mwTail is %p\n", mwTail);
		} else {
			mwWrite("relink: mwTail is NULL, but mwHead is %p\n", mwHead);
		}
	}

	mw1 = NULL;
	if (mwHead != NULL) {
		if (!mwIsReadAddr(mwHead, mwDataSize) || mwHead->check != CHKVAL(mwHead)) {
			mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n", mwHead);
			mwHead = NULL;
			goto scan_reverse;
		}
		if (mwHead->prev != NULL) {
			mwWrite("relink: the mwHead pointer's 'prev' member is %p, not NULL\n", mwHead->prev);
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next) {
				if (!mwIsReadAddr(mw1->next, mwDataSize) ||
					(!mw1->next->check) != CHKVAL(mw1) ||
					mw1->next->prev != mw1) {
					mwWrite("relink: forward chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw1, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw1->file, mw1->line);
					if (mwIsReadAddr(mw1->next, mwDataSize)) {
						mwWrite("relink: forward chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw1->next, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw1->file, 16) ? mw1->file : "<garbage-pointer>", mw1->line);
					} else {
						mwWrite("relink: the 'next' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw1->next);
					}
					break;
				}
			}
		}
	}


scan_reverse:
	mw2 = NULL;
	if (mwTail != NULL) {
		if (!mwIsReadAddr(mwTail, mwDataSize) || mwTail->check != CHKVAL(mwTail)) {
			mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n", mwTail);
			mwTail = NULL;
			goto analyze;
		}
		if (mwTail->next != NULL) {
			mwWrite("relink: the mwTail pointer's 'next' member is %p, not NULL\n", mwTail->next);
		}
		for (mw2 = mwTail; mw2; mw2 = mw2->prev) {
			if (mw2->prev) {
				if (!mwIsReadAddr(mw2->prev, mwDataSize) ||
					(!mw2->prev->check) != CHKVAL(mw2) ||
					mw2->prev->next != mw2) {
					mwWrite("relink: reverse chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw2, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw2->file, mw2->line);
					if (mwIsReadAddr(mw2->prev, mwDataSize)) {
						mwWrite("relink: reverse chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw2->prev, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw2->file, 16) ? mw2->file : "<garbage-pointer>", mw2->line);
					} else {
						mwWrite("relink: the 'prev' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw2->prev);
					}
					break;
				}
			}
		}
	}

analyze:
	if (mwHead == NULL && mwTail == NULL) {
		mwWrite("relink: both head and tail pointers damaged, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	if (mwHead == NULL) {
		mwHead = mw2;
		mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n", mw2);
		mw2->prev = NULL;
		mw1 = mw2 = NULL;
	}
	if (mwTail == NULL) {
		mwTail = mw1;
		mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n", mw1);
		mw1->next = NULL;
		mw1 = mw2 = NULL;
	}
	if (mw1 == NULL && mw2 == NULL &&
		mwHead->prev == NULL && mwTail->next == NULL) {
		mwWrite("relink: verifying heap integrity...\n");
		FLUSH();
		goto verifyok;
	}
	if (mw1 && mw2 && mw1 != mw2) {
		mw1->next = mw2;
		mw2->prev = mw1;
		mwWrite("relink: emergency repairs successful, assessing damage...\n");
		FLUSH();
	} else {
		mwWrite("relink: heap totally destroyed, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}

	/* Verify by checking that the number of active allocations */
	/* match the number of entries in the chain */
verifyok:
	if (!mwIsHeapOK(NULL)) {
		mwWrite("relink: heap verification FAILS - aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	for (size = count = 0, mw1 = mwHead; mw1; mw1 = mw1->next) {
		count ++;
		size += (long) mw1->size;
	}
	if (count == mwNumCurAlloc) {
		mwWrite("relink: successful, ");
		if (size == mwStatCurAlloc) {
			mwWrite("no allocations lost\n");
		} else {
			if (mw != NULL) {
				mwWrite("size information lost for MW-%p\n", mw);
				mw->size = 0;
			}
		}
	} else {
		mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
				mwNmlNumAlloc + mwNumCurAlloc - count, mwNmlCurAlloc + mwStatCurAlloc - size);
		return 0;
	}

	return 1;
}